

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_write_locking.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  char *__s;
  
  uVar1 = get_nprocs();
  if ((int)uVar1 < 2) {
    uVar1 = 0;
    __s = "We need more than 1 CPU to run this test.  Skipping.";
  }
  else {
    puts("Testing that non-locking writes will corrupt the kvtree file.");
    puts("NOTE: You will see KVTree errors if this is working correctly:");
    printf("Testing with %d CPUs\n",(ulong)uVar1);
    fflush(_stdout);
    iVar2 = spawn_processes(0);
    if (iVar2 == 0) {
      uVar1 = 1;
      __s = "Non-locking test should have failed, but didn\'t";
    }
    else {
      puts("Non-locking test correctly failed");
      fflush(_stdout);
      puts("Testing that locking writes don\'t corrupt the kvtree file");
      fflush(_stdout);
      iVar2 = spawn_processes(1);
      uVar1 = (uint)(iVar2 != 0);
      __s = "Locking test correctly passed";
      if (iVar2 != 0) {
        __s = "Locking test failed";
      }
    }
  }
  puts(__s);
  return uVar1;
}

Assistant:

int main(int argc, char** argv)
{
  int cpus;

#if defined(__APPLE__)
    int count;
    size_t size = sizeof(count);
    if (sysctlbyname("hw.ncpu", &count, &size, NULL, 0)) {
        cpus = 1;
    } else {
        cpus = count;
    }
#else
    cpus = get_nprocs();
#endif


  if (cpus <= 1) {
    printf("We need more than 1 CPU to run this test.  Skipping.\n");
    return TEST_PASS;
  }
  printf("Testing that non-locking writes will corrupt the kvtree file.\n");
  printf("NOTE: You will see KVTree errors if this is working correctly:\n");
  printf("Testing with %d CPUs\n", cpus);
  fflush(stdout);

  if (spawn_processes(0) != 0) {
    printf("Non-locking test correctly failed\n");
  } else {
    printf("Non-locking test should have failed, but didn't\n");
    return (1);
  }
  fflush(stdout);

  printf("Testing that locking writes don't corrupt the kvtree file\n");
  fflush(stdout);
  if (spawn_processes(1) == 0) {
    printf("Locking test correctly passed\n");
  } else {
    printf("Locking test failed\n");
    return (1);
  }

  return TEST_PASS;
}